

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateIfElse(ExpressionEvalContext *ctx,ExprIfElse *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  bool bVar4;
  int iVar5;
  longlong in_RAX;
  StackFrame **ppSVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  longlong result;
  
  result = in_RAX;
  ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  if ((*ppSVar6)->targetYield != 0) {
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
    pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
    return pEVar7;
  }
  bVar4 = AddInstruction(ctx);
  if ((bVar4) && (pEVar7 = Evaluate(ctx,expression->condition), pEVar7 != (ExprBase *)0x0)) {
    bVar4 = TryTakeLong(pEVar7,&result);
    if (!bVar4) {
      Report(ctx,"ERROR: failed to evaluate \'if\' condition");
      return (ExprBase *)0x0;
    }
    if (result == 0) {
      pEVar7 = expression->falseBlock;
      if (pEVar7 == (ExprBase *)0x0) goto LAB_0014a881;
    }
    else {
      pEVar7 = expression->trueBlock;
    }
    pEVar7 = Evaluate(ctx,pEVar7);
    if (pEVar7 != (ExprBase *)0x0) {
LAB_0014a881:
      pAVar1 = ctx->ctx->allocator;
      iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
      pSVar2 = (expression->super_ExprBase).source;
      pTVar3 = ctx->ctx->typeVoid;
      pEVar7->typeID = 2;
      pEVar7->source = pSVar2;
      pEVar7->type = pTVar3;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
      pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
      return pEVar7;
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateIfElse(ExpressionEvalContext &ctx, ExprIfElse *expression)
{
	if(ctx.stackFrames.back()->targetYield)
		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	long long result;
	if(!TryTakeLong(condition, result))
		return Report(ctx, "ERROR: failed to evaluate 'if' condition");

	if(result)
	{
		if(!Evaluate(ctx, expression->trueBlock))
			return NULL;
	}
	else if(expression->falseBlock)
	{
		if(!Evaluate(ctx, expression->falseBlock))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}